

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O3

int __thiscall rcg::System::getMinorVersion(System *this)

{
  recursive_mutex *__mutex;
  element_type *peVar1;
  int iVar2;
  undefined8 uVar3;
  uint32_t ret;
  INFO_DATATYPE type;
  size_t size;
  int local_28;
  INFO_DATATYPE local_24;
  size_t local_20;
  
  __mutex = &this->mtx;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    local_28 = 0;
    local_20 = 4;
    peVar1 = (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (this->tl == (TL_HANDLE)0x0) {
      (*peVar1->GCGetInfo)(10,&local_24,&local_28,&local_20);
    }
    else {
      (*peVar1->TLGetInfo)(this->tl,10,&local_24,&local_28,&local_20);
    }
    iVar2 = local_28;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return iVar2;
  }
  uVar3 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

int System::getMinorVersion()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);
  uint32_t ret=0;

  GenTL::INFO_DATATYPE type;
  size_t size=sizeof(ret);

  if (tl != 0)
  {
    gentl->TLGetInfo(tl, GenTL::TL_INFO_GENTL_VER_MINOR, &type, &ret, &size);
  }
  else
  {
    gentl->GCGetInfo(GenTL::TL_INFO_GENTL_VER_MINOR, &type, &ret, &size);
  }

  return static_cast<int>(ret);
}